

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execSwap<(moira::Instr)123,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint uVar3;
  Moira *in_RDI;
  u32 dat;
  int rg;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  uVar2 = readD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc);
  prefetch<4ul>(in_RDI);
  uVar3 = uVar2 >> 0x10 | uVar2 << 0x10;
  writeD<(moira::Size)4>(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  bVar1 = NBIT<(moira::Size)4>((ulong)uVar3);
  (in_RDI->reg).sr.n = bVar1;
  bVar1 = ZERO<(moira::Size)4>((ulong)uVar3);
  (in_RDI->reg).sr.z = bVar1;
  (in_RDI->reg).sr.v = false;
  (in_RDI->reg).sr.c = false;
  return;
}

Assistant:

void
Moira::execSwap(u16 opcode)
{
    int rg  = ( _____________xxx(opcode) );
    u32 dat = readD(rg);

    prefetch<POLLIPL>();

    dat = (dat >> 16) | (dat & 0xFFFF) << 16;
    writeD(rg, dat);

    reg.sr.n = NBIT<Long>(dat);
    reg.sr.z = ZERO<Long>(dat);
    reg.sr.v = 0;
    reg.sr.c = 0;
}